

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::json_abi_v3_11_3::detail::input_stream_adapter::~input_stream_adapter
          (input_stream_adapter *this)

{
  long *plVar1;
  undefined8 uVar2;
  _Ios_Iostate __a;
  long *in_RDI;
  
  if (*in_RDI != 0) {
    plVar1 = (long *)*in_RDI;
    uVar2 = *(undefined8 *)(*plVar1 + -0x18);
    __a = std::ios::rdstate();
    std::operator&(__a,_S_eofbit);
    std::ios::clear((int)plVar1 + (int)uVar2);
  }
  return;
}

Assistant:

~input_stream_adapter()
    {
        // clear stream flags; we use underlying streambuf I/O, do not
        // maintain ifstream flags, except eof
        if (is != nullptr)
        {
            is->clear(is->rdstate() & std::ios::eofbit);
        }
    }